

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

bool __thiscall pg::PPSolver::setupRegion(PPSolver *this,int i,int p,bool mustReset)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  unsigned_long *puVar2;
  uint64_t *puVar3;
  bool bVar4;
  int iVar5;
  reference piVar6;
  size_t sVar7;
  byte local_fa;
  undefined1 local_d8 [16];
  undefined1 local_c8 [28];
  int j;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  const_iterator local_a0;
  PPSolver *local_98;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  const_iterator local_78;
  undefined1 local_70 [28];
  int i_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  bool mustReset_local;
  int p_local;
  int i_local;
  PPSolver *this_local;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  __range2._7_1_ = mustReset;
  if (!mustReset) {
    pvVar1 = this->regions;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + p);
    register0x00000000 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + p);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)(local_70 + 0x18)), bVar4) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_70._20_4_ = *piVar6;
      if (this->region[(int)local_70._20_4_] == p) {
        bitset::operator[]((bitset *)local_70,(size_t)&this->Z);
        bitset::reference::operator=((reference *)local_70,true);
      }
      else {
        bVar4 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_70._20_4_);
        if (((bVar4) || (this->region[(int)local_70._20_4_] < p)) ||
           ((p < this->region[(int)local_70._20_4_] &&
            ((this->region[(int)local_70._20_4_] & 1U) != (p & 1U))))) {
          __range2._7_1_ = 1;
          break;
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  local_c8._20_4_ = i;
  if ((__range2._7_1_ & 1) == 0) {
    pvVar1 = this->regions;
    local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this->regions + p);
    local_90 = (int *)std::vector<int,_std::allocator<int>_>::end(this->regions + p);
    local_98 = this;
    local_80 = std::
               remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,pg::PPSolver::setupRegion(int,int,bool)::__0>
                         (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_90,(anon_class_8_1_8991fb9c_for__M_pred)this);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_78,
               &local_80);
    local_a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(this->regions + p);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_a0,
               &local_a8);
    register0x00000000 = std::vector<int,_std::allocator<int>_>::erase(pvVar1 + p,local_78,local_a0)
    ;
  }
  else {
    bVar4 = std::vector<int,_std::allocator<int>_>::empty(this->regions + p);
    if (!bVar4) {
      resetRegion(this,p);
    }
    local_10 = &this->Z;
    puVar2 = local_10->_bits;
    puVar3 = local_10->_bits;
    sVar7 = bitset::num_blocks(local_10);
    local_11 = '\0';
    std::fill<unsigned_long*,char>(puVar2,puVar3 + sVar7,&local_11);
  }
  while( true ) {
    bVar4 = false;
    if (-1 < (int)local_c8._20_4_) {
      iVar5 = Solver::priority(&this->super_Solver,local_c8._20_4_);
      bVar4 = iVar5 == p;
    }
    if (!bVar4) break;
    if (this->region[(int)local_c8._20_4_] != -2) {
      bVar4 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_c8._20_4_);
      if (bVar4) {
        this->region[(int)local_c8._20_4_] = -2;
      }
      else if (this->region[(int)local_c8._20_4_] == p) {
        bitset::operator[]((bitset *)local_c8,(size_t)&this->Z);
        bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_c8);
        if (bVar4) {
          local_fa = 0;
          if (this->strategy[(int)local_c8._20_4_] != -1) {
            bitset::operator[]((bitset *)local_d8,(size_t)&this->Z);
            bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_d8);
            local_fa = bVar4 ^ 0xff;
          }
          if ((local_fa & 1) != 0) {
            this->strategy[(int)local_c8._20_4_] = -1;
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    (this->regions + p,(value_type_conflict *)(local_c8 + 0x14));
          this->strategy[(int)local_c8._20_4_] = -1;
        }
      }
    }
    local_c8._20_4_ = local_c8._20_4_ + -1;
  }
  local_20 = &this->Z;
  puVar2 = local_20->_bits;
  puVar3 = local_20->_bits;
  sVar7 = bitset::num_blocks(local_20);
  this_local._7_1_ = 0;
  std::fill<unsigned_long*,char>(puVar2,puVar3 + sVar7,(char *)((long)&this_local + 7));
  bVar4 = std::vector<int,_std::allocator<int>_>::empty(this->regions + p);
  if (!bVar4) {
    attract(this,p);
  }
  this_local._6_1_ = !bVar4;
  return this_local._6_1_;
}

Assistant:

bool
PPSolver::setupRegion(int i, int p, bool mustReset)
{
    // NOTE: a node can be "disabled" and in a region (after dominion attraction)
    
    if (!mustReset) {
        // Check if we must reset anyway (because region is tainted)
        // When must a region be reset?
        // - some vertices are in a dominion (now disabled)
        // - some vertices are already reset (i.e., attracted by opponent, then reset)
        // - some vertices are attracted to a higher OPPONENT region
        // When does a region not need to be reset?
        // - some vertices are attracted to a higher SAME-PARITY region
        for (int i : regions[p]) {
            if (region[i] == p) {
                Z[i] = true;
            } else if (disabled[i] or region[i] < p or (region[i] > p and (region[i]&1) != (p&1))) {
                mustReset = true;
                break;
            }
        }
    }

    if (mustReset) {
        if (!regions[p].empty()) resetRegion(p);
        Z.reset();
    } else {
        // No reset, but remove escapes (to be added) and remove things in a higher region...
        // The reason is that there may be vertices of priority p that are not yet in the region vector
        regions[p].erase(std::remove_if(regions[p].begin(), regions[p].end(),
                [&](const int x){ return Z[x] != 1; }),
                regions[p].end());
    }

    // Add all escapes to regions vector
    for (int j=i; j>=0 && priority(j) == p; j--) {
        if (region[j] == -2) continue; // already known to be disabled
        else if (disabled[j]) region[j] = -2; // set now to region -2
        else if (region[j] == p) { // is [to be] in region!
            if (Z[j]) {
                // already in the region, but check strategy
                if (strategy[j] != -1 and !Z[strategy[j]]) strategy[j] = -1;
                continue;
            } else {
                regions[p].push_back(j);
                strategy[j] = -1;
            }
        }
    }

    Z.reset();

    // If the region is empty, return false
    if (regions[p].empty()) return false;

    // Otherwise, attract and return true
    attract(p);
    return true;
}